

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall TPZSkylMatrix<double>::Decompose_LDLt(TPZSkylMatrix<double> *this)

{
  char cVar1;
  double **ppdVar2;
  bool bVar3;
  int iVar4;
  int extraout_var;
  long lVar5;
  double *pdVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  TPZVec<double> diag;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  TPZVec<double> local_50;
  long size;
  
  cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_LDLt() [TVar = double]",
               "Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  size = CONCAT44(extraout_var,iVar4);
  TPZVec<double>::TPZVec(&local_50,size);
  if (size != 0 && -1 < extraout_var) {
    ppdVar2 = (this->fElem).fStore;
    lVar11 = 0;
    do {
      local_50.fStore[lVar11] = *ppdVar2[lVar11];
      lVar11 = lVar11 + 1;
    } while (size != lVar11);
    if (size != 1) {
      lVar11 = 1;
      local_78 = 2;
      local_80 = 3;
      local_70 = 8;
      local_88 = 0x10;
      do {
        ppdVar2 = (this->fElem).fStore;
        lVar5 = (long)ppdVar2[lVar11 + 1] - (long)ppdVar2[lVar11] >> 3;
        if (0 < lVar5) {
          lVar17 = (lVar11 - lVar5) + 1;
          lVar8 = local_78 - lVar5;
          lVar12 = local_80 - lVar5;
          lVar18 = local_88 + lVar5 * -8;
          lVar5 = lVar17;
          do {
            ppdVar2 = (this->fElem).fStore;
            pdVar6 = ppdVar2[lVar5];
            lVar14 = (long)ppdVar2[lVar5 + 1] - (long)pdVar6 >> 3;
            lVar9 = (lVar5 + 1) - lVar14;
            if (lVar9 < lVar17) {
              lVar9 = lVar17;
            }
            pdVar13 = ppdVar2[lVar11];
            if (lVar9 < lVar5) {
              lVar14 = lVar12 - lVar14;
              lVar15 = lVar14;
              if (lVar14 < lVar8) {
                lVar15 = lVar8;
              }
              dVar19 = 0.0;
              lVar16 = 0;
              do {
                dVar19 = dVar19 + *(double *)((long)pdVar13 + lVar16 + lVar15 * -8 + local_70) *
                                  *(double *)((long)pdVar6 + lVar16 + lVar18 + lVar15 * -8) *
                                  local_50.fStore[lVar9];
                lVar9 = lVar9 + 1;
                lVar16 = lVar16 + -8;
              } while (lVar9 < lVar5);
              if (lVar14 < lVar8) {
                lVar14 = lVar8;
              }
              pdVar10 = (double *)((long)local_50.fStore + (lVar14 * 8 - lVar16));
              pdVar13 = (double *)((long)pdVar13 + lVar16 + lVar14 * -8 + local_70);
            }
            else {
              pdVar13 = pdVar13 + (lVar11 - lVar9);
              pdVar6 = pdVar6 + (lVar5 - lVar9);
              pdVar10 = local_50.fStore + lVar9;
              dVar19 = 0.0;
            }
            dVar19 = *pdVar13 - dVar19;
            *pdVar13 = dVar19;
            if (pdVar6 == pdVar13) {
              *pdVar10 = dVar19;
              if (ABS(dVar19) < 1e-12) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TPZSkylMatrix pivot = ",0x16);
                poVar7 = std::ostream::_M_insert<double>(*pdVar13);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TPZSkylMatrix::DecomposeLDLt zero pivot\n",0x28);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"j = ",4);
                poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," l = ",5);
                poVar7 = std::ostream::_M_insert<long>((long)poVar7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
              }
            }
            else {
              *pdVar13 = dVar19 / *pdVar6;
            }
            lVar12 = lVar12 + 1;
            lVar18 = lVar18 + 8;
            bVar3 = lVar5 < lVar11;
            lVar5 = lVar5 + 1;
          } while (bVar3);
        }
        lVar11 = lVar11 + 1;
        local_78 = local_78 + 1;
        local_80 = local_80 + 1;
        local_70 = local_70 + 8;
        local_88 = local_88 + 8;
      } while (lVar11 != size);
    }
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_50.fStore != (double *)0x0) {
    operator_delete__(local_50.fStore);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt()
{
    
    if( this->fDecomposed == ELDLt) return 1;
    if (  this->fDecomposed )
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt()");
#endif
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TPZVec<TVar> diag(dimension);
    for(j=0; j<dimension; j++)
    {
        diag[j] = *fElem[j];
    }
    
    //std::cout << "TPZSkylMatrix<TVar>::Decompose_LDLt: dimension = " << dimension  << std::endl;
    
    TVar sum;
    j = 1;
    while(j < dimension) {
        /*    if(!(j%100) && Dim() > 100) {
         cout <<  j << ' ';
         cout.flush();
         }
         if(!(j%1000)) cout << endl;*/
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            TVar *diagptr = &diag[k];
            sum = 0.;
            while(k < l) {
                //		  sum += *elj-- * *ell-- * *(fElem[k++]);
                //EBORIN: trocar *diagptr++ por *diagptr-- ajuda na vetorização?
                if constexpr(is_complex<TVar>::value){
                    sum += (*elj--) * std::conj(*ell--) * (*diagptr++);
                }else{
                    sum += (*elj--) * (*ell--) * (*diagptr++);
                }
                k++;
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
#ifdef PZ_LOG
                std::stringstream sout;
                sout << "col = " << j << " diagonal " << *elj;
                LOGPZ_DEBUG(logger,sout.str())
#endif
                
                *diagptr = *elj;
                cout << "TPZSkylMatrix pivot = " << *elj << endl;
                cout << "TPZSkylMatrix::DecomposeLDLt zero pivot\n";
                cout << "j = " << j << " l = " << l << endl;
            }
            else
            {
                *diagptr = *elj;
            }
            l++;
        }
        j++;
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}